

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O2

ion_status_t flat_file_delete(ion_flat_file_t *flat_file,ion_key_t key)

{
  byte bVar1;
  byte bVar2;
  ion_status_t iVar3;
  ulong location;
  byte bVar4;
  long lVar5;
  ion_fpos_t start_location;
  int iVar6;
  long lVar7;
  ion_fpos_t loc;
  ion_key_t local_80;
  ion_flat_file_row_t local_78;
  ion_flat_file_row_t last_row;
  ion_flat_file_row_t row;
  
  if (flat_file->sorted_mode != '\0') {
    iVar3.error = '\x14';
    iVar3._1_3_ = 0;
    iVar3.count = 0;
    return iVar3;
  }
  loc = -1;
  start_location = -1;
  iVar6 = 0;
  lVar5 = 0;
  local_80 = key;
  while (bVar1 = flat_file_scan(flat_file,start_location,&loc,&row,'\x01',
                                flat_file_predicate_key_match,local_80), start_location = loc,
        bVar1 == 0) {
    lVar7 = flat_file->eof_position - flat_file->row_size;
    location = (ulong)(lVar7 - flat_file->start_of_data) / flat_file->row_size;
    if (location != loc) {
      bVar2 = flat_file_read_row(flat_file,location,&last_row);
      if ((bVar2 != 0) ||
         (bVar2 = flat_file_write_row(flat_file,start_location,&last_row), bVar2 != 0))
      goto LAB_00105e50;
    }
    local_78.row_status = '\0';
    local_78._1_7_ = 0;
    local_78.key = (ion_key_t)0x0;
    local_78.value = (ion_value_t)0x0;
    bVar2 = flat_file_write_row(flat_file,location,&local_78);
    if (bVar2 != 0) goto LAB_00105e50;
    flat_file->eof_position = lVar7;
    lVar5 = lVar5 + -0x100000000;
    iVar6 = iVar6 + -1;
  }
  bVar2 = bVar1;
  if (bVar1 == 0xe) {
    bVar2 = 0;
  }
  bVar4 = 1;
  if (iVar6 != 0) {
    bVar4 = bVar2;
  }
  if (loc == -1) {
    bVar2 = bVar4;
  }
  if (bVar1 == 0xe) {
    bVar2 = bVar4;
  }
LAB_00105e50:
  return (ion_status_t)((ulong)bVar2 - lVar5);
}

Assistant:

ion_status_t
flat_file_delete(
	ion_flat_file_t *flat_file,
	ion_key_t		key
) {
	if (flat_file->sorted_mode) {
		return ION_STATUS_ERROR(err_sorted_order_violation);
	}

	ion_status_t		status	= ION_STATUS_INITIALIZE;
	ion_flat_file_row_t row;
	ion_err_t			err;
	ion_fpos_t			loc		= -1;

	while (err_ok == (err = flat_file_scan(flat_file, loc, &loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key))) {
		ion_fpos_t			last_record_offset	= flat_file->eof_position - flat_file->row_size;
		ion_flat_file_row_t last_row;
		ion_fpos_t			last_record_index	= (last_record_offset - flat_file->start_of_data) / flat_file->row_size;
		ion_err_t			row_err;

		/* If the last index and the loc are the same, then we can just move the eof position. Saves a read/write. */
		if (last_record_index != loc) {
			row_err = flat_file_read_row(flat_file, last_record_index, &last_row);

			if (err_ok != row_err) {
				status.error = row_err;
				return status;
			}

			row_err = flat_file_write_row(flat_file, loc, &last_row);

			if (err_ok != row_err) {
				status.error = row_err;
				return status;
			}
		}

		/* Set last row to be empty just for sanity reasons. */
		row_err = flat_file_write_row(flat_file, last_record_index, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_EMPTY, NULL, NULL });

		if (err_ok != row_err) {
			status.error = row_err;
			return status;
		}

		/* Soft truncate the file by bumping the eof position back to cut off the last record. */
		flat_file->eof_position = last_record_offset;
		status.count++;

		/* No location movement is done here, since we need to check the row we just swapped in to see if it is
		   also a match. */
	}

	status.error = err_ok;

	if (((err == err_file_hit_eof) || (-1 == loc)) && (status.count == 0)) {
		status.error = err_item_not_found;
	}
	else if (err != err_file_hit_eof) {
		status.error = err;
	}

	return status;
}